

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_tests.cpp
# Opt level: O2

void __thiscall
mempool_tests::MempoolAncestryTestsDiamond::test_method(MempoolAncestryTestsDiamond *this)

{
  CTxMemPool *this_00;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar1;
  long lVar2;
  iterator pvVar3;
  iterator pvVar4;
  size_t *psVar5;
  long in_FS_OFFSET;
  initializer_list<long> __l;
  initializer_list<long> __l_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  initializer_list<long> __l_02;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<long> __l_05;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_06;
  initializer_list<unsigned_int> __l_07;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_288;
  allocator_type local_26b;
  allocator_type local_26a;
  allocator_type local_269;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_268;
  _Vector_base<long,_std::allocator<long>_> local_248;
  CTransactionRef td;
  CTransactionRef tc;
  CTransactionRef tb;
  CTransactionRef ta;
  TestMemPoolEntryHelper entry;
  size_t descendants;
  size_t ancestors;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_170 [16];
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_160 [16];
  uint local_60 [2];
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                     (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.mempool,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                      ,0x2fe,"test_method","m_node.mempool");
  this_00 = (puVar1->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
             ,0x2ff,false);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&this_00->cs,"pool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
             ,0x2ff,false);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  ta.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  ta.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tb.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  tb.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  tc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  td.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  td.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48._M_ptr = (element_type *)&DAT_3b9aca00;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_48;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_170,__l,(allocator_type *)&local_58);
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  make_tx((mempool_tests *)&local_288,(vector<long,_std::allocator<long>_> *)local_170,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&local_248,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_268);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&ta.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_288._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_268);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_248);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)local_170);
  local_48._M_ptr = (element_type *)0x1dcd6500;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x11e1a300;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_48;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_170,__l_00,(allocator_type *)local_60);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&ta.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_58;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_248,__l_01,&local_269);
  local_268._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  make_tx((mempool_tests *)&local_288,(vector<long,_std::allocator<long>_> *)local_170,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&local_248,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_268);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&tb.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_288._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_268);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)local_170);
  local_58._M_ptr = (element_type *)0xbebc200;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_58;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_170,__l_02,(allocator_type *)&local_269);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&tb.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_48;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_248,__l_03,&local_26a);
  local_60[0] = 1;
  __l_04._M_len = 1;
  __l_04._M_array = local_60;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_268,__l_04,&local_26b);
  make_tx((mempool_tests *)&local_288,(vector<long,_std::allocator<long>_> *)local_170,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&local_248,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_268);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&tc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_288._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_268);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)local_170);
  local_58._M_ptr = (element_type *)0x23c34600;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_58;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_248,__l_05,(allocator_type *)&local_269);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_170,
             &tb.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (local_160,&tc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_170;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_268,__l_06,&local_26a);
  local_60[0] = 0;
  local_60[1] = 0;
  __l_07._M_len = 2;
  __l_07._M_array = local_60;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288,__l_07,&local_26b);
  make_tx((mempool_tests *)&local_48,(vector<long,_std::allocator<long>_> *)&local_248,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&local_268,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&td.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_288);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_268);
  lVar2 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -8);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_248);
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_170,&entry,&ta);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_170);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_170);
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_170,&entry,&tb);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_170);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_170);
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_170,&entry,&tc);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_170);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_170);
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_170,&entry,&td);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_170);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_170);
  pvVar3 = (iterator)0x0;
  pvVar4 = (iterator)0x0;
  CTxMemPool::GetTransactionAncestry
            (this_00,&((ta.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->hash).m_wrapped,&ancestors,&descendants,(size_t *)0x0,(CAmount *)0x0);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x31a;
  file.m_begin = (iterator)&local_298;
  msg.m_end = pvVar4;
  msg.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a8,msg);
  local_170[8] = 0;
  local_170._0_8_ = &PTR__lazy_ostream_011480b0;
  local_160[0]._M_ptr = (element_type *)boost::unit_test::lazy_ostream::inst;
  local_160[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc7f1cc;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2b0 = "";
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000001;
  pvVar3 = (iterator)0x2;
  psVar5 = &ancestors;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (local_170,&local_2b8,0x31a,1,2,psVar5,"ancestors",&local_248,"1ULL");
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x31b;
  file_00.m_begin = (iterator)&local_2c8;
  msg_00.m_end = (iterator)psVar5;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2d8,
             msg_00);
  local_170[8] = 0;
  local_170._0_8_ = &PTR__lazy_ostream_011480b0;
  local_160[0]._M_ptr = (element_type *)boost::unit_test::lazy_ostream::inst;
  local_160[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc7f1cc;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2e0 = "";
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (local_170,&local_2e8,0x31b,1,2,&descendants,"descendants",&local_248,"4ULL");
  pvVar3 = (iterator)0x0;
  pvVar4 = (iterator)0x0;
  CTxMemPool::GetTransactionAncestry
            (this_00,&((tb.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->hash).m_wrapped,&ancestors,&descendants,(size_t *)0x0,(CAmount *)0x0);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x31d;
  file_01.m_begin = (iterator)&local_2f8;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_308,
             msg_01);
  local_170[8] = 0;
  local_170._0_8_ = &PTR__lazy_ostream_011480b0;
  local_160[0]._M_ptr = (element_type *)boost::unit_test::lazy_ostream::inst;
  local_160[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc7f1cc;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_310 = "";
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  pvVar3 = (iterator)0x2;
  psVar5 = &ancestors;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (local_170,&local_318,0x31d,1,2,psVar5,"ancestors",&local_248,"2ULL");
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x31e;
  file_02.m_begin = (iterator)&local_328;
  msg_02.m_end = (iterator)psVar5;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_338,
             msg_02);
  local_170[8] = 0;
  local_170._0_8_ = &PTR__lazy_ostream_011480b0;
  local_160[0]._M_ptr = (element_type *)boost::unit_test::lazy_ostream::inst;
  local_160[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc7f1cc;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_340 = "";
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (local_170,&local_348,0x31e,1,2,&descendants,"descendants",&local_248,"4ULL");
  pvVar3 = (iterator)0x0;
  pvVar4 = (iterator)0x0;
  CTxMemPool::GetTransactionAncestry
            (this_00,&((tc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->hash).m_wrapped,&ancestors,&descendants,(size_t *)0x0,(CAmount *)0x0);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x320;
  file_03.m_begin = (iterator)&local_358;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_368,
             msg_03);
  local_170[8] = 0;
  local_170._0_8_ = &PTR__lazy_ostream_011480b0;
  local_160[0]._M_ptr = (element_type *)boost::unit_test::lazy_ostream::inst;
  local_160[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc7f1cc;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_370 = "";
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  pvVar3 = (iterator)0x2;
  psVar5 = &ancestors;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (local_170,&local_378,800,1,2,psVar5,"ancestors",&local_248,"3ULL");
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x321;
  file_04.m_begin = (iterator)&local_388;
  msg_04.m_end = (iterator)psVar5;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_398,
             msg_04);
  local_170[8] = 0;
  local_170._0_8_ = &PTR__lazy_ostream_011480b0;
  local_160[0]._M_ptr = (element_type *)boost::unit_test::lazy_ostream::inst;
  local_160[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc7f1cc;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3a0 = "";
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (local_170,&local_3a8,0x321,1,2,&descendants,"descendants",&local_248,"4ULL");
  pvVar3 = (iterator)0x0;
  pvVar4 = (iterator)0x0;
  CTxMemPool::GetTransactionAncestry
            (this_00,&((td.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->hash).m_wrapped,&ancestors,&descendants,(size_t *)0x0,(CAmount *)0x0);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x323;
  file_05.m_begin = (iterator)&local_3b8;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3c8,
             msg_05);
  local_170[8] = 0;
  local_170._0_8_ = &PTR__lazy_ostream_011480b0;
  local_160[0]._M_ptr = (element_type *)boost::unit_test::lazy_ostream::inst;
  local_160[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc7f1cc;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3d0 = "";
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  pvVar3 = (iterator)0x2;
  psVar5 = &ancestors;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (local_170,&local_3d8,0x323,1,2,psVar5,"ancestors",&local_248,"4ULL");
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x324;
  file_06.m_begin = (iterator)&local_3e8;
  msg_06.m_end = (iterator)psVar5;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3f8,
             msg_06);
  local_170[8] = 0;
  local_170._0_8_ = &PTR__lazy_ostream_011480b0;
  local_160[0]._M_ptr = (element_type *)boost::unit_test::lazy_ostream::inst;
  local_160[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc7f1cc;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_400 = "";
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (local_170,&local_408,0x324,1,2,&descendants,"descendants",&local_248,"4ULL");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&td.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tb.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ta.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(MempoolAncestryTestsDiamond)
{
    size_t ancestors, descendants;

    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    /* Ancestors represented more than once ("diamond") */
    //
    // [ta].0 <- [tb].0 -----<------- [td].0
    //            |                    |
    //            \---1 <- [tc].0 --<--/
    //
    CTransactionRef ta, tb, tc, td;
    ta = make_tx(/*output_values=*/{10 * COIN});
    tb = make_tx(/*output_values=*/{5 * COIN, 3 * COIN}, /*inputs=*/ {ta});
    tc = make_tx(/*output_values=*/{2 * COIN}, /*inputs=*/{tb}, /*input_indices=*/{1});
    td = make_tx(/*output_values=*/{6 * COIN}, /*inputs=*/{tb, tc}, /*input_indices=*/{0, 0});
    pool.addUnchecked(entry.Fee(10000LL).FromTx(ta));
    pool.addUnchecked(entry.Fee(10000LL).FromTx(tb));
    pool.addUnchecked(entry.Fee(10000LL).FromTx(tc));
    pool.addUnchecked(entry.Fee(10000LL).FromTx(td));

    // Ancestors / descendants should be:
    // transaction  ancestors           descendants
    // ============ =================== ===========
    // ta           1 (ta               4 (ta,tb,tc,td)
    // tb           2 (ta,tb)           4 (ta,tb,tc,td)
    // tc           3 (ta,tb,tc)        4 (ta,tb,tc,td)
    // td           4 (ta,tb,tc,td)     4 (ta,tb,tc,td)
    pool.GetTransactionAncestry(ta->GetHash(), ancestors, descendants);
    BOOST_CHECK_EQUAL(ancestors, 1ULL);
    BOOST_CHECK_EQUAL(descendants, 4ULL);
    pool.GetTransactionAncestry(tb->GetHash(), ancestors, descendants);
    BOOST_CHECK_EQUAL(ancestors, 2ULL);
    BOOST_CHECK_EQUAL(descendants, 4ULL);
    pool.GetTransactionAncestry(tc->GetHash(), ancestors, descendants);
    BOOST_CHECK_EQUAL(ancestors, 3ULL);
    BOOST_CHECK_EQUAL(descendants, 4ULL);
    pool.GetTransactionAncestry(td->GetHash(), ancestors, descendants);
    BOOST_CHECK_EQUAL(ancestors, 4ULL);
    BOOST_CHECK_EQUAL(descendants, 4ULL);
}